

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.h
# Opt level: O2

double __thiscall libDAI::TProb<double>::log(TProb<double> *this,double __x)

{
  double in_RAX;
  long *in_RSI;
  size_t i;
  ulong uVar1;
  double dVar2;
  double local_28;
  
  dVar2 = 0.0;
  (this->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_28 = in_RAX;
  std::vector<double,_std::allocator<double>_>::reserve(&this->_p,in_RSI[1] - *in_RSI >> 3);
  for (uVar1 = 0; uVar1 < (ulong)(in_RSI[1] - *in_RSI >> 3); uVar1 = uVar1 + 1) {
    dVar2 = ::log(*(double *)(*in_RSI + uVar1 * 8));
    local_28 = dVar2;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(&this->_p,&local_28);
  }
  return dVar2;
}

Assistant:

TProb<T> log() const {
                TProb<T> l;
                l._p.reserve( size() );
                for( size_t i = 0; i < size(); i++ )
                    l._p.push_back( std::log( _p[i] ) );
                return l;
            }